

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O3

void Omega_h::find_matches_deg<4,long>
               (LOs *a2fv,Read<int> *av2v,Read<int> *bv2v,Adj *v2b,Write<int> *a2b_out,
               Write<signed_char> *codes_out,bool allow_duplicates)

{
  int *piVar1;
  LOs *pLVar2;
  void *pvVar3;
  void *pvVar4;
  Alloc *pAVar5;
  int size_in;
  undefined8 this;
  Write<signed_char> *pWVar6;
  long *plVar7;
  Alloc *pAVar8;
  ulong uVar9;
  size_t sVar10;
  bool bVar11;
  bool bVar12;
  ScopedTimer omega_h_scoped_function_timer;
  LOs v2vb;
  Read<signed_char> vb_codes;
  Write<signed_char> codes;
  Write<int> a2b;
  type f;
  LOs vb2b;
  ScopedTimer local_171;
  Alloc *local_170;
  LOs *local_168;
  Alloc *local_160;
  void *local_158;
  undefined1 local_150 [32];
  ulong local_130 [2];
  Write<signed_char> local_120;
  Write<int> local_110;
  type local_100;
  Write<int> *local_78;
  Read<int> *local_70;
  Alloc *local_68;
  void *local_60;
  long local_58;
  void *local_48;
  Read<int> *local_40;
  Write<signed_char> *local_38;
  
  local_168 = a2fv;
  local_78 = a2b_out;
  local_68 = (Alloc *)&local_58;
  local_38 = codes_out;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,"");
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_68);
  pAVar8 = (Alloc *)(plVar7 + 2);
  if ((Alloc *)*plVar7 == pAVar8) {
    local_150._0_8_ = pAVar8->size;
    local_150._8_8_ = plVar7[3];
    local_160 = (Alloc *)local_150;
  }
  else {
    local_150._0_8_ = pAVar8->size;
    local_160 = (Alloc *)*plVar7;
  }
  local_158 = (void *)plVar7[1];
  *plVar7 = (long)pAVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_150._16_8_ = local_130;
  std::__cxx11::string::_M_construct((ulong)(local_150 + 0x10),'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_150._16_8_,3,0x169);
  uVar9 = 0xf;
  if (local_160 != (Alloc *)local_150) {
    uVar9 = local_150._0_8_;
  }
  if (uVar9 < (ulong)(local_150._24_8_ + (long)local_158)) {
    uVar9 = 0xf;
    if ((ulong *)local_150._16_8_ != local_130) {
      uVar9 = local_130[0];
    }
    if ((ulong)(local_150._24_8_ + (long)local_158) <= uVar9) {
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)(local_150 + 0x10),0,(char *)0x0,(ulong)local_160);
      goto LAB_001daeda;
    }
  }
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_160,local_150._16_8_);
LAB_001daeda:
  local_100.a2fv.write_.shared_alloc_.alloc = (Alloc *)&local_100.v2vb;
  pAVar8 = (Alloc *)(plVar7 + 2);
  if ((Alloc *)*plVar7 == pAVar8) {
    local_100.v2vb.write_.shared_alloc_.alloc = (Alloc *)pAVar8->size;
    local_100.v2vb.write_.shared_alloc_.direct_ptr = (void *)plVar7[3];
  }
  else {
    local_100.v2vb.write_.shared_alloc_.alloc = (Alloc *)pAVar8->size;
    local_100.a2fv.write_.shared_alloc_.alloc = (Alloc *)*plVar7;
  }
  local_100.a2fv.write_.shared_alloc_.direct_ptr = (void *)plVar7[1];
  *plVar7 = (long)pAVar8;
  plVar7[1] = 0;
  *(undefined1 *)&pAVar8->size = 0;
  begin_code("find_matches_deg",(char *)local_100.a2fv.write_.shared_alloc_.alloc);
  if (local_100.a2fv.write_.shared_alloc_.alloc != (Alloc *)&local_100.v2vb) {
    operator_delete(local_100.a2fv.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_100.v2vb.write_.shared_alloc_.alloc)->size + 1));
  }
  if ((ulong *)local_150._16_8_ != local_130) {
    operator_delete((void *)local_150._16_8_,local_130[0] + 1);
  }
  if (local_160 != (Alloc *)local_150) {
    operator_delete(local_160,local_150._0_8_ + 1);
  }
  if (local_68 != (Alloc *)&local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  pAVar8 = (local_168->write_).shared_alloc_.alloc;
  if (((ulong)pAVar8 & 1) == 0) {
    sVar10 = pAVar8->size;
  }
  else {
    sVar10 = (ulong)pAVar8 >> 3;
  }
  size_in = (int)(sVar10 >> 2);
  pAVar8 = (av2v->write_).shared_alloc_.alloc;
  if (((ulong)pAVar8 & 1) == 0) {
    uVar9 = pAVar8->size;
  }
  else {
    uVar9 = (ulong)pAVar8 >> 3;
  }
  if (size_in * 4 != (int)(uVar9 >> 3)) {
    fail("assertion %s failed at %s +%d\n","na * deg == av2v.size()",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
         ,0x16b);
  }
  local_160 = (v2b->super_Graph).a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_160 = (Alloc *)(local_160->size * 8 + 1);
    }
    else {
      local_160->use_count = local_160->use_count + 1;
    }
  }
  pvVar3 = (v2b->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
  local_68 = (v2b->super_Graph).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68 = (Alloc *)(local_68->size * 8 + 1);
    }
    else {
      local_68->use_count = local_68->use_count + 1;
    }
  }
  pAVar8 = local_68;
  pvVar4 = (v2b->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_150._16_8_ = (v2b->codes).write_.shared_alloc_.alloc;
  if ((local_150._16_8_ & 7) == 0 && (Alloc *)local_150._16_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_150._16_8_ = ((Alloc *)local_150._16_8_)->size * 8 + 1;
    }
    else {
      ((Alloc *)local_150._16_8_)->use_count = ((Alloc *)local_150._16_8_)->use_count + 1;
    }
  }
  this = local_150._16_8_;
  local_150._24_8_ = (v2b->codes).write_.shared_alloc_.direct_ptr;
  pLVar2 = &local_100.v2vb;
  local_170 = local_160;
  local_158 = pvVar3;
  local_100.a2fv.write_.shared_alloc_.alloc = (Alloc *)pLVar2;
  local_70 = av2v;
  local_60 = pvVar4;
  local_48 = (void *)local_150._24_8_;
  local_40 = bv2v;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
  Write<int>::Write(&local_110,size_in,(string *)&local_100);
  if (local_100.a2fv.write_.shared_alloc_.alloc != (Alloc *)pLVar2) {
    operator_delete(local_100.a2fv.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_100.v2vb.write_.shared_alloc_.alloc)->size + 1));
  }
  local_100.a2fv.write_.shared_alloc_.alloc = (Alloc *)pLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
  Write<signed_char>::Write((Write<signed_char> *)(local_130 + 2),size_in,(string *)&local_100);
  if (local_100.a2fv.write_.shared_alloc_.alloc != (Alloc *)pLVar2) {
    operator_delete(local_100.a2fv.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_100.v2vb.write_.shared_alloc_.alloc)->size + 1));
  }
  local_100.a2fv.write_.shared_alloc_.alloc = (local_168->write_).shared_alloc_.alloc;
  if (((ulong)local_100.a2fv.write_.shared_alloc_.alloc & 7) == 0 &&
      local_100.a2fv.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100.a2fv.write_.shared_alloc_.alloc =
           (Alloc *)((local_100.a2fv.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_100.a2fv.write_.shared_alloc_.alloc)->use_count =
           (local_100.a2fv.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_100.a2fv.write_.shared_alloc_.direct_ptr = (local_168->write_).shared_alloc_.direct_ptr;
  local_100.v2vb.write_.shared_alloc_.alloc = local_170;
  bVar11 = ((ulong)local_170 & 7) == 0;
  local_168 = (LOs *)CONCAT71(local_168._1_7_,bVar11 && local_170 != (Alloc *)0x0);
  if (bVar11 && local_170 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100.v2vb.write_.shared_alloc_.alloc = (Alloc *)(local_170->size * 8 + 1);
    }
    else {
      local_170->use_count = local_170->use_count + 1;
    }
  }
  bVar11 = ((ulong)pAVar8 & 7) == 0;
  local_100.vb2b.write_.shared_alloc_.alloc = pAVar8;
  if (bVar11 && pAVar8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100.vb2b.write_.shared_alloc_.alloc = (Alloc *)(pAVar8->size * 8 + 1);
    }
    else {
      pAVar8->use_count = pAVar8->use_count + 1;
    }
  }
  bVar12 = (this & 7) == 0;
  local_100.vb_codes.write_.shared_alloc_.alloc = (Alloc *)this;
  if (bVar12 && (Alloc *)this != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100.vb_codes.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)this * 8 + 1);
    }
    else {
      *(int *)(this + 0x30) = *(int *)(this + 0x30) + 1;
    }
  }
  local_100.vb_codes.write_.shared_alloc_.direct_ptr = local_48;
  local_100.av2v.write_.shared_alloc_.alloc = (local_70->write_).shared_alloc_.alloc;
  if (((ulong)local_100.av2v.write_.shared_alloc_.alloc & 7) == 0 &&
      local_100.av2v.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100.av2v.write_.shared_alloc_.alloc =
           (Alloc *)((local_100.av2v.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_100.av2v.write_.shared_alloc_.alloc)->use_count =
           (local_100.av2v.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_100.av2v.write_.shared_alloc_.direct_ptr = (local_70->write_).shared_alloc_.direct_ptr;
  local_100.bv2v.write_.shared_alloc_.alloc = (local_40->write_).shared_alloc_.alloc;
  if (((ulong)local_100.bv2v.write_.shared_alloc_.alloc & 7) == 0 &&
      local_100.bv2v.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100.bv2v.write_.shared_alloc_.alloc =
           (Alloc *)((local_100.bv2v.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_100.bv2v.write_.shared_alloc_.alloc)->use_count =
           (local_100.bv2v.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_100.bv2v.write_.shared_alloc_.direct_ptr = (local_40->write_).shared_alloc_.direct_ptr;
  local_100.a2b.shared_alloc_.alloc = local_110.shared_alloc_.alloc;
  if (((ulong)local_110.shared_alloc_.alloc & 7) == 0 &&
      local_110.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100.a2b.shared_alloc_.alloc = (Alloc *)((local_110.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_110.shared_alloc_.alloc)->use_count = (local_110.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_100.a2b.shared_alloc_.direct_ptr = local_110.shared_alloc_.direct_ptr;
  local_100.codes.shared_alloc_.alloc = local_120.shared_alloc_.alloc;
  if (((ulong)local_120.shared_alloc_.alloc & 7) == 0 &&
      local_120.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100.codes.shared_alloc_.alloc = (Alloc *)((local_120.shared_alloc_.alloc)->size * 8 + 1)
      ;
    }
    else {
      (local_120.shared_alloc_.alloc)->use_count = (local_120.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_100.codes.shared_alloc_.direct_ptr = local_120.shared_alloc_.direct_ptr;
  local_100.allow_duplicates = allow_duplicates;
  local_100.v2vb.write_.shared_alloc_.direct_ptr = pvVar3;
  local_100.vb2b.write_.shared_alloc_.direct_ptr = pvVar4;
  parallel_for<Omega_h::find_matches_deg<4,long>(Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<long>,Omega_h::Adj,Omega_h::Write<int>*,Omega_h::Write<signed_char>*,bool)::_lambda(int)_1_>
            (size_in,&local_100);
  pWVar6 = local_38;
  pAVar5 = (local_78->shared_alloc_).alloc;
  if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
    piVar1 = &pAVar5->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar5);
      operator_delete(pAVar5,0x48);
    }
  }
  (local_78->shared_alloc_).alloc = local_110.shared_alloc_.alloc;
  if (((ulong)local_110.shared_alloc_.alloc & 7) == 0 &&
      local_110.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (local_78->shared_alloc_).alloc = (Alloc *)((local_110.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_110.shared_alloc_.alloc)->use_count = (local_110.shared_alloc_.alloc)->use_count + 1;
    }
  }
  (local_78->shared_alloc_).direct_ptr = local_110.shared_alloc_.direct_ptr;
  pAVar5 = (pWVar6->shared_alloc_).alloc;
  if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
    piVar1 = &pAVar5->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar5);
      operator_delete(pAVar5,0x48);
    }
  }
  (pWVar6->shared_alloc_).alloc = local_120.shared_alloc_.alloc;
  if (((ulong)local_120.shared_alloc_.alloc & 7) == 0 &&
      local_120.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (pWVar6->shared_alloc_).alloc = (Alloc *)((local_120.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_120.shared_alloc_.alloc)->use_count = (local_120.shared_alloc_.alloc)->use_count + 1;
    }
  }
  (pWVar6->shared_alloc_).direct_ptr = local_120.shared_alloc_.direct_ptr;
  find_matches_deg<4,long>(Omega_h::Read<int>,Omega_h::Read<long>,Omega_h::Read<long>,Omega_h::Adj,Omega_h::Write<int>*,Omega_h::Write<signed_char>*,bool)
  ::{lambda(int)#1}::~Write((_lambda_int__1_ *)&local_100);
  if (((ulong)local_120.shared_alloc_.alloc & 7) == 0 &&
      local_120.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_120.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_120.shared_alloc_.alloc);
      operator_delete(local_120.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_110.shared_alloc_.alloc & 7) == 0 &&
      local_110.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_110.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_110.shared_alloc_.alloc);
      operator_delete(local_110.shared_alloc_.alloc,0x48);
    }
  }
  if (bVar12 && (Alloc *)this != (Alloc *)0x0) {
    piVar1 = (int *)(this + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)this);
      operator_delete((void *)this,0x48);
    }
  }
  if (bVar11 && pAVar8 != (Alloc *)0x0) {
    piVar1 = &pAVar8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar8);
      operator_delete(pAVar8,0x48);
    }
  }
  pAVar8 = local_170;
  if ((char)local_168 != '\0') {
    piVar1 = &local_170->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_170);
      operator_delete(pAVar8,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_171);
  return;
}

Assistant:

void find_matches_deg(LOs const a2fv, Read<T> const av2v,
    Read<T> const bv2v, Adj const v2b, Write<LO>* a2b_out, Write<I8>* codes_out,
    bool const allow_duplicates) {
  OMEGA_H_TIME_FUNCTION;
  LO const na = a2fv.size();
  OMEGA_H_CHECK(na * deg == av2v.size());
  LOs const v2vb = v2b.a2ab;
  LOs const vb2b = v2b.ab2b;
  Read<I8> const vb_codes = v2b.codes;
  Write<LO> a2b(na);
  Write<I8> codes(na);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto const fv = a2fv[a];
    auto const a_begin = a * deg;
    auto const vb_begin = v2vb[fv];
    auto const vb_end = v2vb[fv + 1];
    bool found = false;
    for (LO vb = vb_begin; vb < vb_end; ++vb) {
      auto const b = vb2b[vb];
      auto const vb_code = vb_codes[vb];
      auto const which_down = code_which_down(vb_code);
      auto const b_begin = b * deg;
      I8 match_code;
      if (IsMatch<deg>::eval(
              av2v, a_begin, bv2v, b_begin, which_down, &match_code)) {
        OMEGA_H_CHECK(!found);  // there can't be more than one!
        a2b[a] = b;
        codes[a] = match_code;
        found = true;
        if (allow_duplicates) break;
      }
    }
    (void)found;
    OMEGA_H_CHECK(found);  // there can't be less than one!
  };
  parallel_for(na, std::move(f));
  *a2b_out = a2b;
  *codes_out = codes;
}